

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O3

void * shemu_memcpy(void *Dest,void *Source,ND_SIZET Size)

{
  ND_SIZET NVar1;
  
  if (Source == (void *)0x0 || Dest == (void *)0x0) {
    Dest = (void *)0x0;
  }
  else if (Size != 0) {
    NVar1 = 0;
    do {
      *(undefined1 *)((long)Dest + NVar1) = *(undefined1 *)((long)Source + NVar1);
      NVar1 = NVar1 + 1;
    } while (Size != NVar1);
  }
  return Dest;
}

Assistant:

void *
shemu_memcpy(
    void *Dest,
    const void *Source,
    ND_SIZET Size
    )
{
    if (ND_NULL == Dest)
    {
        return ND_NULL;
    }

    if (ND_NULL == Source)
    {
        return ND_NULL;
    }

    for (ND_SIZET index = 0; index < Size; index++)
    {
        ((char *)Dest)[index] = ((const char *)Source)[index];
    }

    return Dest;
}